

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup::~IfcStructuralLoadGroup
          (IfcStructuralLoadGroup *this,void **vtt)

{
  void *pvVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x1d];
  pcVar2 = (this->Purpose).ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->Purpose).ptr.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->ActionSource)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->ActionSource).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->ActionType)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->ActionType).field_2) {
    operator_delete(pcVar2);
  }
  puVar3 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).
             field_0x10;
  if (puVar3 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).
                 field_0x20) {
    operator_delete(puVar3);
  }
  pvVar1 = vtt[2];
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0xe];
  *(void **)&this->field_0x88 = vtt[0xf];
  *(void **)&this->field_0x98 = vtt[0x10];
  if (*(undefined1 **)&this->field_0xa8 != &this->field_0xb8) {
    operator_delete(*(undefined1 **)&this->field_0xa8);
  }
  pvVar1 = vtt[4];
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[7];
  if (*(undefined1 **)&this->field_0x60 != &this->field_0x70) {
    operator_delete(*(undefined1 **)&this->field_0x60);
  }
  if (*(undefined1 **)&this->field_0x38 != &this->field_0x48) {
    operator_delete(*(undefined1 **)&this->field_0x38);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
    return;
  }
  return;
}

Assistant:

IfcStructuralLoadGroup() : Object("IfcStructuralLoadGroup") {}